

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelToPlaneRow_C(uint8 *src_sobelx,uint8 *src_sobely,uint8 *dst_y,int width)

{
  int32 iVar1;
  int s;
  int b;
  int r;
  int i;
  int width_local;
  uint8 *dst_y_local;
  uint8 *src_sobely_local;
  uint8 *src_sobelx_local;
  
  for (b = 0; b < width; b = b + 1) {
    iVar1 = libyuv::clamp255((uint)src_sobelx[b] + (uint)src_sobely[b]);
    dst_y[b] = (uint8)iVar1;
  }
  return;
}

Assistant:

void SobelToPlaneRow_C(const uint8* src_sobelx,
                       const uint8* src_sobely,
                       uint8* dst_y,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int s = clamp255(r + b);
    dst_y[i] = (uint8)(s);
  }
}